

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_jumps.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4b0c6::ir_lower_jumps_visitor::visit
          (ir_lower_jumps_visitor *this,ir_loop_jump *ir)

{
  bool bVar1;
  jump_strength jVar2;
  exec_node *local_20;
  ir_loop_jump *ir_local;
  ir_lower_jumps_visitor *this_local;
  
  local_20 = (exec_node *)0x0;
  if (ir != (ir_loop_jump *)0x0) {
    local_20 = &(ir->super_ir_jump).super_ir_instruction.super_exec_node;
  }
  truncate_after_instruction(this,local_20);
  bVar1 = ir_loop_jump::is_break(ir);
  jVar2 = strength_continue;
  if (bVar1) {
    jVar2 = strength_break;
  }
  (this->block).min_strength = jVar2;
  return;
}

Assistant:

virtual void visit(class ir_loop_jump * ir)
   {
      /* Eliminate all instructions after each one, since they are
       * unreachable.  This satisfies the DEAD_CODE_ELIMINATION
       * postcondition.
       */
      truncate_after_instruction(ir);

      /* Set this->block.min_strength based on this instruction.  This
       * satisfies the ANALYSIS postcondition.  It is not necessary to
       * update this->block.may_clear_execute_flag or
       * this->loop.may_set_return_flag, because an unlowered jump
       * instruction can't change any flags.
       */
      this->block.min_strength = ir->is_break() ? strength_break : strength_continue;

      /* The CONTAINED_JUMPS_LOWERED postcondition is already
       * satisfied, because jump statements can't contain other
       * statements.
       */
   }